

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slatm1.c
# Opt level: O1

int slatm1_slu(int *mode,float *cond,int *irsign,int *idist,int *iseed,float *d,int *n,int *info)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  float *pfVar6;
  int iVar7;
  float fVar8;
  float fVar9;
  double dVar10;
  int i__1;
  int local_34;
  double local_30;
  
  *info = 0;
  if (*n == 0) {
    return 0;
  }
  iVar3 = *mode;
  iVar7 = -1;
  if (0xfffffff2 < iVar3 - 7U) {
    if (iVar3 == -6) goto LAB_00108c9c;
    if (iVar3 == 0) goto LAB_00108cac;
    if (iVar3 == 6) goto LAB_00108c9c;
    iVar7 = -2;
    if (1 < (uint)*irsign) goto LAB_00108cea;
    if (iVar3 == -6) {
LAB_00108c9c:
      iVar7 = -4;
      if (*idist - 4U < 0xfffffffd) goto LAB_00108cea;
    }
    else if (iVar3 != 0) {
      if (iVar3 != 6) {
        iVar7 = -3;
        if (*cond <= 1.0 && *cond != 1.0) goto LAB_00108cea;
        if ((iVar3 != 6) && (iVar3 != -6)) goto LAB_00108cac;
      }
      goto LAB_00108c9c;
    }
LAB_00108cac:
    if (-1 < *n) goto LAB_00108ced;
    iVar7 = -7;
  }
LAB_00108cea:
  *info = iVar7;
LAB_00108ced:
  if (*info == 0) {
    iVar3 = *mode;
    if (iVar3 != 0) {
      iVar7 = -iVar3;
      if (0 < iVar3) {
        iVar7 = iVar3;
      }
      switch(iVar7) {
      case 2:
        uVar1 = *n;
        if ((int)uVar1 < 1) {
          lVar4 = 1;
        }
        else {
          lVar4 = 1;
          do {
            d[lVar4 + -1] = 1.0;
            lVar4 = lVar4 + 1;
          } while ((ulong)uVar1 + 1 != lVar4);
        }
        slatm1_slu::i = (int)lVar4;
        d[(long)(int)uVar1 + -1] = 1.0 / *cond;
        break;
      case 3:
        *d = 1.0;
        if (1 < *n) {
          dVar10 = pow((double)*cond,(double)(-1.0 / (float)(*n + -1)));
          slatm1_slu::alpha = (float)dVar10;
          local_34 = *n;
          slatm1_slu::i = 2;
          if (1 < local_34) {
            lVar4 = 1;
            do {
              fVar9 = powif(slatm1_slu::alpha,(int)lVar4);
              lVar4 = (long)slatm1_slu::i;
              d[lVar4 + -1] = fVar9;
              iVar3 = slatm1_slu::i + 1;
              bVar2 = slatm1_slu::i < local_34;
              slatm1_slu::i = iVar3;
            } while (bVar2);
          }
        }
        break;
      case 4:
        *d = 1.0;
        uVar1 = *n;
        if (1 < (int)uVar1) {
          fVar9 = *cond;
          fVar8 = (1.0 - 1.0 / fVar9) / (float)(int)(uVar1 - 1);
          iVar3 = uVar1 - 2;
          lVar4 = 2;
          slatm1_slu::alpha = fVar8;
          do {
            d[lVar4 + -1] = (float)iVar3 * fVar8 + 1.0 / fVar9;
            lVar4 = lVar4 + 1;
            iVar3 = iVar3 + -1;
          } while ((ulong)uVar1 + 1 != lVar4);
          slatm1_slu::i = (int)lVar4;
        }
        break;
      case 5:
        dVar10 = log((double)(1.0 / *cond));
        slatm1_slu::alpha = (float)dVar10;
        local_34 = *n;
        slatm1_slu::i = 1;
        if (0 < local_34) {
          do {
            local_30 = (double)slatm1_slu::alpha;
            dVar10 = dlaran_sluslu(iseed);
            dVar10 = exp(dVar10 * local_30);
            d[(long)slatm1_slu::i + -1] = (float)dVar10;
            iVar3 = slatm1_slu::i + 1;
            bVar2 = slatm1_slu::i < local_34;
            slatm1_slu::i = iVar3;
          } while (bVar2);
        }
        break;
      case 6:
        slarnv_slu(idist,iseed,n,d);
        break;
      default:
        uVar1 = *n;
        if ((int)uVar1 < 1) {
          lVar4 = 1;
        }
        else {
          lVar4 = 1;
          do {
            d[lVar4 + -1] = 1.0 / *cond;
            lVar4 = lVar4 + 1;
          } while ((ulong)uVar1 + 1 != lVar4);
        }
        slatm1_slu::i = (int)lVar4;
        *d = 1.0;
      }
      if (((0xc < *mode + 6U) || ((0x1041U >> (*mode + 6U & 0x1f) & 1) == 0)) && (*irsign == 1)) {
        local_34 = *n;
        slatm1_slu::i = 1;
        if (0 < local_34) {
          do {
            dVar10 = dlaran_sluslu(iseed);
            if (0.5 < (float)dVar10) {
              d[(long)slatm1_slu::i + -1] = -d[(long)slatm1_slu::i + -1];
            }
            iVar3 = slatm1_slu::i + 1;
            bVar2 = slatm1_slu::i < local_34;
            slatm1_slu::i = iVar3;
          } while (bVar2);
        }
      }
      if (*mode < 0) {
        uVar1 = *n;
        uVar5 = 1;
        if (1 < (int)uVar1) {
          pfVar6 = d + uVar1;
          uVar5 = 1;
          do {
            pfVar6 = pfVar6 + -1;
            fVar9 = d[uVar5 - 1];
            d[uVar5 - 1] = *pfVar6;
            *pfVar6 = fVar9;
            uVar5 = uVar5 + 1;
          } while ((int)uVar1 / 2 + 1 != uVar5);
        }
        slatm1_slu::i = (int)uVar5;
      }
    }
  }
  else {
    local_34 = -*info;
    input_error("SLATM1",&local_34);
  }
  return 0;
}

Assistant:

int slatm1_slu(int *mode, float *cond, int *irsign,
	int *idist, int *iseed, float *d, int *n, int *info)
{
    /* System generated locals */
    int i__1, i__2;
    double d__1, d__2;

    /* Local variables */
    static float temp;
    static int i;
    static float alpha;
    extern int input_error(char *, int *);
    extern double dlaran_sluslu(int *);
    extern /* Subroutine */ int slarnv_slu(int *, int *, int *, float
	    *);


/*  -- LAPACK auxiliary test routine (version 2.0) --   
       Univ. of Tennessee, Univ. of California Berkeley, NAG Ltd.,   
       Courant Institute, Argonne National Lab, and Rice University   
       September 30, 1994   


    Purpose   
    =======   

       SLATM1 computes the entries of D(1..N) as specified by   
       MODE, COND and IRSIGN. IDIST and ISEED determine the generation   
       of random numbers. SLATM1 is called by SLATMR to generate   
       random test matrices for LAPACK programs.   

    Arguments   
    =========   

    MODE   - INTEGER   
             On entry describes how D is to be computed:   
             MODE = 0 means do not change D.   
             MODE = 1 sets D(1)=1 and D(2:N)=1.0/COND   
             MODE = 2 sets D(1:N-1)=1 and D(N)=1.0/COND   
             MODE = 3 sets D(I)=COND**(-(I-1)/(N-1))   
             MODE = 4 sets D(i)=1 - (i-1)/(N-1)*(1 - 1/COND)   
             MODE = 5 sets D to random numbers in the range   
                      ( 1/COND , 1 ) such that their logarithms   
                      are uniformly distributed.   
             MODE = 6 set D to random numbers from same distribution   
                      as the rest of the matrix.   
             MODE < 0 has the same meaning as ABS(MODE), except that   
                the order of the elements of D is reversed.   
             Thus if MODE is positive, D has entries ranging from   
                1 to 1/COND, if negative, from 1/COND to 1,   
             Not modified.   

    COND   - REAL   
             On entry, used as described under MODE above.   
             If used, it must be >= 1. Not modified.   

    IRSIGN - INTEGER   
             On entry, if MODE neither -6, 0 nor 6, determines sign of   
             entries of D   
             0 => leave entries of D unchanged   
             1 => multiply each entry of D by 1 or -1 with probability .5 
  

    IDIST  - CHARACTER*1   
             On entry, IDIST specifies the type of distribution to be   
             used to generate a random matrix .   
             1 => UNIFORM( 0, 1 )   
             2 => UNIFORM( -1, 1 )   
             3 => NORMAL( 0, 1 )   
             Not modified.   

    ISEED  - INTEGER array, dimension ( 4 )   
             On entry ISEED specifies the seed of the random number   
             generator. The random number generator uses a   
             linear congruential sequence limited to small   
             integers, and so should produce machine independent   
             random numbers. The values of ISEED are changed on   
             exit, and can be used in the next call to SLATM1   
             to continue the same random number sequence.   
             Changed on exit.   

    D      - REAL array, dimension ( MIN( M , N ) )   
             Array to be computed according to MODE, COND and IRSIGN.   
             May be changed on exit if MODE is nonzero.   

    N      - INTEGER   
             Number of entries of D. Not modified.   

    INFO   - INTEGER   
              0  => normal termination   
             -1  => if MODE not in range -6 to 6   
             -2  => if MODE neither -6, 0 nor 6, and   
                    IRSIGN neither 0 nor 1   
             -3  => if MODE neither -6, 0 nor 6 and COND less than 1   
             -4  => if MODE equals 6 or -6 and IDIST not in range 1 to 3 
  
             -7  => if N negative   

    ===================================================================== 
  


       Decode and Test the input parameters. Initialize flags & seed.   

       Parameter adjustments */
    --d;
    --iseed;

    /* Function Body */
    *info = 0;

/*     Quick return if possible */

    if (*n == 0) {
	return 0;
    }

/*     Set INFO if an error */

    if (*mode < -6 || *mode > 6) {
	*info = -1;
    } else if (*mode != -6 && *mode != 0 && *mode != 6 && (*irsign != 0 && *
	    irsign != 1)) {
	*info = -2;
    } else if (*mode != -6 && *mode != 0 && *mode != 6 && *cond < 1.f) {
	*info = -3;
    } else if ((*mode == 6 || *mode == -6) && (*idist < 1 || *idist > 3)) {
	*info = -4;
    } else if (*n < 0) {
	*info = -7;
    }

    if (*info != 0) {
	i__1 = -(*info);
	input_error("SLATM1", &i__1);
	return 0;
    }

/*     Compute D according to COND and MODE */

    if (*mode != 0) {
	switch (abs(*mode)) {
	    case 1:  goto L10;
	    case 2:  goto L30;
	    case 3:  goto L50;
	    case 4:  goto L70;
	    case 5:  goto L90;
	    case 6:  goto L110;
	}

/*        One large D value: */

L10:
	i__1 = *n;
	for (i = 1; i <= i__1; ++i) {
	    d[i] = 1.f / *cond;
/* L20: */
	}
	d[1] = 1.f;
	goto L120;

/*        One small D value: */

L30:
	i__1 = *n;
	for (i = 1; i <= i__1; ++i) {
	    d[i] = 1.f;
/* L40: */
	}
	d[*n] = 1.f / *cond;
	goto L120;

/*        Exponentially distributed D values: */

L50:
	d[1] = 1.f;
	if (*n > 1) {
	    d__1 = (double) (*cond);
	    d__2 = (double) (-1.f / (float) (*n - 1));
            alpha = pow(d__1, d__2);
	    i__1 = *n;
	    for (i = 2; i <= i__1; ++i) {
		i__2 = i - 1;
		d[i] = powif(alpha, i__2);
/* L60: */
	    }
	}
	goto L120;

/*        Arithmetically distributed D values: */

L70:
	d[1] = 1.f;
	if (*n > 1) {
	    temp = 1.f / *cond;
	    alpha = (1.f - temp) / (float) (*n - 1);
	    i__1 = *n;
	    for (i = 2; i <= i__1; ++i) {
		d[i] = (float) (*n - i) * alpha + temp;
/* L80: */
	    }
	}
	goto L120;

/*        Randomly distributed D values on ( 1/COND , 1): */

L90:
	alpha = log(1.f / *cond);
	i__1 = *n;
	for (i = 1; i <= i__1; ++i) {
	    d[i] = exp(alpha * dlaran_sluslu(&iseed[1]));
/* L100: */
	}
	goto L120;

/*        Randomly distributed D values from IDIST */

L110:
	slarnv_slu(idist, &iseed[1], n, &d[1]);

L120:

/*        If MODE neither -6 nor 0 nor 6, and IRSIGN = 1, assign   
          random signs to D */

	if (*mode != -6 && *mode != 0 && *mode != 6 && *irsign == 1) {
	    i__1 = *n;
	    for (i = 1; i <= i__1; ++i) {
		temp = dlaran_sluslu(&iseed[1]);
		if (temp > .5f) {
		    d[i] = -(double)d[i];
		}
/* L130: */
	    }
	}

/*        Reverse if MODE < 0 */

	if (*mode < 0) {
	    i__1 = *n / 2;
	    for (i = 1; i <= i__1; ++i) {
		temp = d[i];
		d[i] = d[*n + 1 - i];
		d[*n + 1 - i] = temp;
/* L140: */
	    }
	}

    }

    return 0;

/*     End of SLATM1 */

}